

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int SetUserCVar(int playernum,char *cvarname,int value,bool is_string)

{
  uint32 uVar1;
  FBaseCVar *pFVar2;
  FBaseCVar *cvar_1;
  FBaseCVar *cvar;
  FBaseCVar **local_28;
  FBaseCVar **cvar_p;
  bool is_string_local;
  char *pcStack_18;
  int value_local;
  char *cvarname_local;
  int playernum_local;
  
  if (((uint)playernum < 8) && ((playeringame[playernum] & 1U) != 0)) {
    cvar_p._3_1_ = is_string;
    cvar_p._4_4_ = value;
    pcStack_18 = cvarname;
    cvarname_local._0_4_ = playernum;
    FName::FName((FName *)((long)&cvar + 4),cvarname,true);
    local_28 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                         ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           *)((long)playernum * 0x2a0 + 0xd63498),(FName *)((long)&cvar + 4));
    if ((((local_28 == (FBaseCVar **)0x0) || (pFVar2 = *local_28, pFVar2 == (FBaseCVar *)0x0)) ||
        (uVar1 = FBaseCVar::GetFlags(pFVar2), (uVar1 & 0x4000) != 0)) ||
       (uVar1 = FBaseCVar::GetFlags(pFVar2), (uVar1 & 0x2000) == 0)) {
      cvarname_local._4_4_ = 0;
    }
    else {
      DoSetCVar(pFVar2,cvar_p._4_4_,(bool)(cvar_p._3_1_ & 1),false);
      if (((int)cvarname_local == consoleplayer) &&
         (pFVar2 = FindCVar(pcStack_18,(FBaseCVar **)0x0), pFVar2 != (FBaseCVar *)0x0)) {
        DoSetCVar(pFVar2,cvar_p._4_4_,(bool)(cvar_p._3_1_ & 1),true);
      }
      cvarname_local._4_4_ = 1;
    }
  }
  else {
    cvarname_local._4_4_ = 0;
  }
  return cvarname_local._4_4_;
}

Assistant:

static int SetUserCVar(int playernum, const char *cvarname, int value, bool is_string)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return 0;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	// Only mod-created cvars may be set.
	if (cvar_p == NULL || (cvar = *cvar_p) == NULL || (cvar->GetFlags() & CVAR_IGNORE) || !(cvar->GetFlags() & CVAR_MOD))
	{
		return 0;
	}
	DoSetCVar(cvar, value, is_string);

	// If we are this player, then also reflect this change in the local version of this cvar.
	if (playernum == consoleplayer)
	{
		FBaseCVar *cvar = FindCVar(cvarname, NULL);
		// If we can find it in the userinfo, then we should also be able to find it in the normal cvar list,
		// but check just to be safe.
		if (cvar != NULL)
		{
			DoSetCVar(cvar, value, is_string, true);
		}
	}

	return 1;
}